

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_perl_generator.cc
# Opt level: O2

void __thiscall t_perl_generator::~t_perl_generator(t_perl_generator *this)

{
  ~t_perl_generator(this);
  operator_delete(this);
  return;
}

Assistant:

t_perl_generator(t_program* program,
                   const std::map<std::string, std::string>& parsed_options,
                   const std::string& option_string)
    : t_oop_generator(program), f_types_use_includes_emitted_(false) {
    (void)option_string;
    std::map<std::string, std::string>::const_iterator iter;

    /* no options yet */
    for( iter = parsed_options.begin(); iter != parsed_options.end(); ++iter) {
      throw "unknown option perl:" + iter->first;
    }

    out_dir_base_ = "gen-perl";
    escape_['$'] = "\\$";
    escape_['@'] = "\\@";
  }